

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotLineEx<ImPlot::GetterXsYs<int>>(char *label_id,GetterXsYs<int> *getter)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar7;
  uint uVar8;
  double dVar9;
  ImPlotRange *pIVar10;
  ImPlotContext *pIVar11;
  GetterXsYs<int> *getter_00;
  int *piVar12;
  ImPlotContext *pIVar13;
  bool bVar14;
  uint uVar15;
  ImU32 col;
  long lVar16;
  ulong uVar17;
  int *piVar18;
  int *piVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  float fVar28;
  undefined8 local_a0;
  float local_94;
  GetterXsYs<int> *local_90;
  undefined8 local_88;
  ImU32 local_80;
  ImU32 local_7c;
  ImDrawList *local_78;
  int *local_70;
  uint local_64;
  ulong local_60;
  ulong local_58;
  int *local_50;
  int *local_48;
  ImPlotContext *local_40;
  long local_38;
  
  bVar14 = BeginItem(label_id,0);
  pIVar11 = GImPlot;
  if (bVar14) {
    if ((GImPlot->FitThisFrame == true) && (iVar1 = getter->Count, 0 < iVar1)) {
      piVar18 = getter->Xs;
      piVar19 = getter->Ys;
      iVar23 = getter->Offset;
      iVar2 = getter->Stride;
      pIVar7 = GImPlot->CurrentPlot;
      iVar22 = pIVar7->CurrentYAxis;
      uVar3 = (pIVar7->XAxis).Flags;
      pIVar10 = GImPlot->ExtentsY;
      uVar4 = pIVar7->YAxis[iVar22].Flags;
      iVar20 = 0;
      uVar21 = uVar4 & 0x20;
      uVar8 = uVar21 >> 5;
      local_40 = (ImPlotContext *)CONCAT44(local_40._4_4_,uVar8);
      pIVar13 = local_40;
      local_88 = CONCAT44(local_88._4_4_,uVar3) & 0xffffffff00000020;
      uVar15 = (uVar3 & 0x20) >> 5;
      local_70 = (int *)CONCAT44(local_70._4_4_,uVar15);
      piVar12 = local_70;
      do {
        lVar16 = (long)(((iVar23 + iVar20) % iVar1 + iVar1) % iVar1) * (long)iVar2;
        iVar5 = *(int *)((long)piVar18 + lVar16);
        dVar26 = (double)iVar5;
        iVar6 = *(int *)((long)piVar19 + lVar16);
        dVar25 = (double)iVar6;
        if ((uVar3 >> 10 & 1) == 0) {
          if ((0 < iVar5) || ((int)local_88 == 0)) {
LAB_001cce33:
            dVar27 = (pIVar11->ExtentsX).Min;
            dVar9 = dVar26;
            if (dVar27 <= dVar26) {
              dVar9 = dVar27;
            }
            (pIVar11->ExtentsX).Min = dVar9;
            dVar27 = (pIVar11->ExtentsX).Max;
            dVar9 = dVar26;
            if (dVar26 <= dVar27) {
              dVar9 = dVar27;
            }
            (pIVar11->ExtentsX).Max = dVar9;
          }
        }
        else if (((pIVar7->YAxis[iVar22].Range.Min <= dVar25) &&
                 (dVar25 <= pIVar7->YAxis[iVar22].Range.Max)) &&
                (local_70._0_1_ = (byte)uVar15, (iVar5 < 1 & (byte)local_70) == 0))
        goto LAB_001cce33;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((0 < iVar6) || (uVar21 == 0)) {
LAB_001cce92:
            dVar26 = pIVar10[iVar22].Min;
            dVar27 = dVar25;
            if (dVar26 <= dVar25) {
              dVar27 = dVar26;
            }
            pIVar10[iVar22].Min = dVar27;
            dVar26 = pIVar11->ExtentsY[iVar22].Max;
            if (dVar25 <= dVar26) {
              dVar25 = dVar26;
            }
            pIVar11->ExtentsY[iVar22].Max = dVar25;
          }
        }
        else if ((((pIVar7->XAxis).Range.Min <= dVar26) && (dVar26 <= (pIVar7->XAxis).Range.Max)) &&
                (local_40._0_1_ = (byte)uVar8, (iVar6 < 1 & (byte)local_40) == 0))
        goto LAB_001cce92;
        iVar20 = iVar20 + 1;
        local_70 = piVar12;
        local_40 = pIVar13;
      } while (iVar1 != iVar20);
    }
    local_90 = getter;
    local_78 = GetPlotDrawList();
    getter_00 = local_90;
    if ((1 < local_90->Count) && ((pIVar11->NextItemData).RenderLine == true)) {
      col = ImGui::GetColorU32((pIVar11->NextItemData).Colors);
      iVar1 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar1]) {
      case 0:
        local_a0 = CONCAT44(local_a0._4_4_,iVar1);
        RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLin>
                  (getter_00,(TransformerLinLin *)&local_a0,local_78,
                   (pIVar11->NextItemData).LineWeight,col);
        break;
      case 1:
        local_a0 = CONCAT44(local_a0._4_4_,iVar1);
        RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLin>
                  (getter_00,(TransformerLogLin *)&local_a0,local_78,
                   (pIVar11->NextItemData).LineWeight,col);
        break;
      case 2:
        local_a0 = CONCAT44(local_a0._4_4_,iVar1);
        RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLog>
                  (getter_00,(TransformerLinLog *)&local_a0,local_78,
                   (pIVar11->NextItemData).LineWeight,col);
        break;
      case 3:
        local_a0 = CONCAT44(local_a0._4_4_,iVar1);
        RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLog>
                  (getter_00,(TransformerLogLog *)&local_a0,local_78,
                   (pIVar11->NextItemData).LineWeight,col);
      }
    }
    if ((pIVar11->NextItemData).Marker != -1) {
      PopPlotClipRect();
      PushPlotClipRect((pIVar11->NextItemData).MarkerSize);
      local_7c = ImGui::GetColorU32((pIVar11->NextItemData).Colors + 2);
      local_80 = ImGui::GetColorU32((pIVar11->NextItemData).Colors + 3);
      transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
      uVar17 = (ulong)transformer.YAxis;
      local_40 = GImPlot;
      local_88 = uVar17;
      switch(GImPlot->Scales[uVar17]) {
      case 0:
        iVar1 = getter_00->Count;
        if (0 < iVar1) {
          piVar18 = getter_00->Xs;
          piVar19 = getter_00->Ys;
          iVar23 = getter_00->Offset;
          local_50 = (int *)CONCAT44(local_50._4_4_,(pIVar11->NextItemData).MarkerSize);
          local_58 = CONCAT44(local_58._4_4_,(pIVar11->NextItemData).MarkerWeight);
          local_60 = (ulong)(pIVar11->NextItemData).Marker;
          iVar2 = getter_00->Stride;
          iVar22 = 0;
          local_90 = (GetterXsYs<int> *)
                     CONCAT44(local_90._4_4_,(uint)(pIVar11->NextItemData).RenderMarkerLine);
          local_94 = (float)(uint)(pIVar11->NextItemData).RenderMarkerFill;
          local_70 = piVar19;
          local_48 = piVar18;
          do {
            lVar16 = (long)(((iVar23 + iVar22) % iVar1 + iVar1) % iVar1) * (long)iVar2;
            fVar24 = (float)(((double)*(int *)((long)piVar18 + lVar16) -
                             (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                            (double)GImPlot->PixelRange[uVar17].Min.x);
            fVar28 = (float)(((double)*(int *)((long)piVar19 + lVar16) -
                             GImPlot->CurrentPlot->YAxis[uVar17].Range.Min) * GImPlot->My[local_88]
                            + (double)GImPlot->PixelRange[uVar17].Min.y);
            local_a0 = CONCAT44(fVar28,fVar24);
            pIVar7 = local_40->CurrentPlot;
            if ((((pIVar7->PlotRect).Min.x <= fVar24) && ((pIVar7->PlotRect).Min.y <= fVar28)) &&
               ((fVar24 < (pIVar7->PlotRect).Max.x && (fVar28 < (pIVar7->PlotRect).Max.y)))) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<int>>(ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_60 * 8))
                        ((ulong)local_50 & 0xffffffff,local_58 & 0xffffffff,local_78,&local_a0,
                         (ulong)local_90 & 0xffffffff,local_7c,local_94,local_80);
              piVar18 = local_48;
              piVar19 = local_70;
            }
            iVar22 = iVar22 + 1;
          } while (iVar1 != iVar22);
        }
        break;
      case 1:
        iVar1 = getter_00->Count;
        if (0 < iVar1) {
          local_48 = getter_00->Xs;
          local_50 = getter_00->Ys;
          local_58 = (ulong)(uint)getter_00->Offset;
          local_60 = CONCAT44(local_60._4_4_,(pIVar11->NextItemData).MarkerSize);
          local_94 = (pIVar11->NextItemData).MarkerWeight;
          local_38 = (long)(pIVar11->NextItemData).Marker;
          local_90 = (GetterXsYs<int> *)(long)getter_00->Stride;
          iVar23 = 0;
          local_64 = (uint)(pIVar11->NextItemData).RenderMarkerLine;
          bVar14 = (pIVar11->NextItemData).RenderMarkerFill;
          do {
            pIVar11 = GImPlot;
            lVar16 = (long)((((int)local_58 + iVar23) % iVar1 + iVar1) % iVar1) * (long)local_90;
            local_70 = (int *)(double)*(int *)((long)local_50 + lVar16);
            dVar26 = log10((double)*(int *)((long)local_48 + lVar16) /
                           (GImPlot->CurrentPlot->XAxis).Range.Min);
            pIVar7 = pIVar11->CurrentPlot;
            dVar25 = (pIVar7->XAxis).Range.Min;
            fVar24 = (float)((((double)(float)(dVar26 / pIVar11->LogDenX) *
                               ((pIVar7->XAxis).Range.Max - dVar25) + dVar25) - dVar25) *
                             pIVar11->Mx + (double)pIVar11->PixelRange[uVar17].Min.x);
            fVar28 = (float)(((double)local_70 - pIVar7->YAxis[uVar17].Range.Min) *
                             pIVar11->My[local_88] + (double)pIVar11->PixelRange[uVar17].Min.y);
            local_a0 = CONCAT44(fVar28,fVar24);
            pIVar7 = local_40->CurrentPlot;
            if ((((pIVar7->PlotRect).Min.x <= fVar24) && ((pIVar7->PlotRect).Min.y <= fVar28)) &&
               ((fVar24 < (pIVar7->PlotRect).Max.x && (fVar28 < (pIVar7->PlotRect).Max.y)))) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<int>>(ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_38 * 8))
                        (local_60 & 0xffffffff,local_94,local_78,&local_a0,local_64,local_7c,bVar14,
                         local_80);
            }
            iVar23 = iVar23 + 1;
          } while (iVar1 != iVar23);
        }
        break;
      case 2:
        iVar1 = getter_00->Count;
        if (0 < iVar1) {
          local_48 = getter_00->Xs;
          local_50 = getter_00->Ys;
          local_58 = (ulong)(uint)getter_00->Offset;
          local_60 = CONCAT44(local_60._4_4_,(pIVar11->NextItemData).MarkerSize);
          local_94 = (pIVar11->NextItemData).MarkerWeight;
          local_38 = (long)(pIVar11->NextItemData).Marker;
          local_90 = (GetterXsYs<int> *)(long)getter_00->Stride;
          iVar23 = 0;
          local_64 = (uint)(pIVar11->NextItemData).RenderMarkerLine;
          bVar14 = (pIVar11->NextItemData).RenderMarkerFill;
          do {
            pIVar11 = GImPlot;
            lVar16 = (long)((((int)local_58 + iVar23) % iVar1 + iVar1) % iVar1) * (long)local_90;
            local_70 = (int *)(double)*(int *)((long)local_48 + lVar16);
            dVar26 = log10((double)*(int *)((long)local_50 + lVar16) /
                           GImPlot->CurrentPlot->YAxis[uVar17].Range.Min);
            pIVar7 = pIVar11->CurrentPlot;
            dVar25 = pIVar7->YAxis[uVar17].Range.Min;
            fVar28 = (float)(((double)local_70 - (pIVar7->XAxis).Range.Min) * pIVar11->Mx +
                            (double)pIVar11->PixelRange[uVar17].Min.x);
            fVar24 = (float)((((double)(float)(dVar26 / pIVar11->LogDenY[local_88]) *
                               (pIVar7->YAxis[uVar17].Range.Max - dVar25) + dVar25) - dVar25) *
                             pIVar11->My[local_88] + (double)pIVar11->PixelRange[uVar17].Min.y);
            local_a0 = CONCAT44(fVar24,fVar28);
            pIVar7 = local_40->CurrentPlot;
            if (((((pIVar7->PlotRect).Min.x <= fVar28) && ((pIVar7->PlotRect).Min.y <= fVar24)) &&
                (fVar28 < (pIVar7->PlotRect).Max.x)) && (fVar24 < (pIVar7->PlotRect).Max.y)) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<int>>(ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_38 * 8))
                        (local_60 & 0xffffffff,local_94,local_78,&local_a0,local_64,local_7c,bVar14,
                         local_80);
            }
            iVar23 = iVar23 + 1;
          } while (iVar1 != iVar23);
        }
        break;
      case 3:
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<int>>
                  (*getter_00,transformer,local_78,(pIVar11->NextItemData).Marker,
                   (pIVar11->NextItemData).MarkerSize,(pIVar11->NextItemData).RenderMarkerLine,
                   local_7c,(pIVar11->NextItemData).MarkerWeight,
                   (pIVar11->NextItemData).RenderMarkerFill,local_80);
      }
    }
    pIVar11 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar11->NextItemData);
    pIVar11->PreviousItem = pIVar11->CurrentItem;
    pIVar11->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotLineEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        if (getter.Count > 1 && s.RenderLine) {
            const ImU32 col_line    = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineStrip(getter, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineStrip(getter, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineStrip(getter, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineStrip(getter, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        if (s.Marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}